

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O3

int LZ4_decompress_safe_continue
              (LZ4_streamDecode_t *LZ4_streamDecode,char *source,char *dest,int compressedSize,
              int maxOutputSize)

{
  ushort *puVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte bVar4;
  ushort uVar5;
  ulong uVar6;
  undefined8 uVar7;
  ushort uVar8;
  uint uVar9;
  int iVar10;
  BYTE *s;
  byte *__src;
  ushort *puVar11;
  ushort *__src_00;
  LZ4_byte *pLVar12;
  ushort *puVar13;
  long lVar14;
  byte *pbVar15;
  byte *pbVar16;
  uint uVar17;
  ulong uVar18;
  BYTE *d_1;
  byte *pbVar19;
  byte *pbVar20;
  ushort *puVar21;
  ulong uVar22;
  BYTE *e;
  ushort *puVar23;
  BYTE *d;
  byte *pbVar24;
  byte *pbVar25;
  ulong uVar26;
  int local_80;
  int local_70;
  
  uVar22 = (LZ4_streamDecode->internal_donotuse).prefixSize;
  if (uVar22 == 0) {
    uVar9 = LZ4_decompress_safe(source,dest,compressedSize,maxOutputSize);
  }
  else {
    if ((LZ4_streamDecode->internal_donotuse).prefixEnd == (LZ4_byte *)dest) {
      if (uVar22 < 0xffff) {
        uVar6 = LZ4_streamDecode->table[1];
        if (uVar6 != 0) {
          if (source == (char *)0x0) {
            return -1;
          }
          pLVar12 = (LZ4_streamDecode->internal_donotuse).externalDict + uVar6;
          if ((LZ4_streamDecode->internal_donotuse).externalDict == (LZ4_byte *)0x0) {
            pLVar12 = (LZ4_byte *)0x0;
          }
          if (maxOutputSize == 0) {
            if (compressedSize != 1) {
              return -1;
            }
            return -(uint)(*source != '\0');
          }
          if (compressedSize == 0) {
            return -1;
          }
          __src = (byte *)(dest + -uVar22);
          puVar1 = (ushort *)(source + compressedSize);
          pbVar3 = (byte *)(dest + maxOutputSize);
          pbVar25 = (byte *)dest;
          __src_00 = (ushort *)source;
          if (maxOutputSize < 0x40) goto LAB_00120506;
          puVar23 = (ushort *)source;
LAB_0011fe23:
          __src_00 = (ushort *)((long)puVar23 + 1);
          bVar4 = (byte)*puVar23;
          uVar9 = (uint)bVar4;
          uVar22 = (ulong)(uint)(bVar4 >> 4);
          if (bVar4 >> 4 == 0xf) {
            if ((ushort *)((long)puVar1 - 0xfU) <= __src_00) goto LAB_0012054f;
            puVar21 = puVar23 + 1;
            uVar17 = 0;
            puVar23 = puVar23 + 8;
            do {
              puVar13 = puVar23;
              puVar11 = __src_00;
              __src_00 = (ushort *)((long)puVar11 + 1);
              uVar17 = uVar17 + *(byte *)((long)puVar13 + -0xf);
              puVar21 = (ushort *)((long)puVar21 + 1);
              puVar23 = (ushort *)((long)puVar13 + 1);
            } while (puVar13 + -7 < (ushort *)((long)puVar1 - 0xfU) &&
                     *(byte *)((long)puVar13 + -0xf) == 0xff);
            uVar22 = (ulong)uVar17 + 0xf;
            pbVar24 = pbVar25 + uVar22;
            if ((CARRY8((ulong)pbVar25,uVar22)) || ((ulong)-(long)puVar21 < uVar22)) {
              __src_00 = puVar13 + -7;
              goto LAB_0012054f;
            }
            if (dest + (long)maxOutputSize + -0x20 < pbVar24) goto LAB_0012035f;
            puVar23 = (ushort *)((ulong)uVar17 + (long)puVar13 + 1);
            if (puVar1 + -0x10 < puVar23) {
              __src_00 = puVar13 + -7;
              goto LAB_0012035f;
            }
            lVar14 = 0;
            do {
              uVar7 = *(undefined8 *)((byte *)((long)__src_00 + lVar14) + 8);
              pbVar15 = pbVar25 + lVar14;
              *(undefined8 *)pbVar15 = *(undefined8 *)((long)__src_00 + lVar14);
              *(undefined8 *)(pbVar15 + 8) = uVar7;
              pbVar2 = (byte *)((long)puVar11 + lVar14 + 0x11);
              uVar7 = *(undefined8 *)(pbVar2 + 8);
              *(undefined8 *)(pbVar15 + 0x10) = *(undefined8 *)pbVar2;
              *(undefined8 *)(pbVar15 + 0x18) = uVar7;
              lVar14 = lVar14 + 0x20;
            } while (pbVar15 + 0x20 < pbVar24);
          }
          else {
            pbVar24 = pbVar25 + uVar22;
            if ((ushort *)((long)puVar1 - 0x11U) < __src_00) goto LAB_0012035f;
            uVar7 = *(undefined8 *)((long)puVar23 + 9);
            *(undefined8 *)pbVar25 = *(undefined8 *)__src_00;
            *(undefined8 *)(pbVar25 + 8) = uVar7;
            puVar23 = (ushort *)(uVar22 + (long)__src_00);
          }
          uVar5 = *puVar23;
          uVar26 = (ulong)uVar5;
          __src_00 = puVar23 + 1;
          pbVar15 = pbVar24 + -uVar26;
          uVar22 = (ulong)(bVar4 & 0xf);
          if (uVar22 == 0xf) {
            if ((uVar6 < 0x10000) && (pbVar15 + uVar6 < __src)) goto LAB_0012054f;
            uVar9 = 0;
            puVar23 = __src_00;
            do {
              __src_00 = (ushort *)((long)puVar23 + 1);
              if (puVar1 + -2 <= __src_00) goto LAB_0012054f;
              uVar8 = *puVar23;
              uVar9 = uVar9 + (byte)uVar8;
              puVar23 = __src_00;
            } while ((byte)uVar8 == 0xff);
            uVar22 = (ulong)uVar9;
            if ((byte *)(-0x10 - uVar22) < pbVar24) goto LAB_0012054f;
            uVar18 = uVar22 + 0x13;
            if (pbVar3 + -0x40 <= pbVar24 + uVar22 + 0x13) goto LAB_001203e7;
          }
          else {
            uVar18 = uVar22 + 4;
            if (pbVar3 + -0x40 <= pbVar24 + uVar22 + 4) goto LAB_001203e7;
            if ((__src <= pbVar15) && (7 < uVar5)) {
              *(undefined8 *)pbVar24 = *(undefined8 *)pbVar15;
              *(undefined8 *)(pbVar24 + 8) = *(undefined8 *)(pbVar15 + 8);
              *(undefined2 *)(pbVar24 + 0x10) = *(undefined2 *)(pbVar15 + 0x10);
              pbVar25 = pbVar24 + uVar22 + 4;
              puVar23 = __src_00;
              goto LAB_0011fe23;
            }
          }
          if ((uVar6 < 0x10000) && (pbVar15 + uVar6 < __src)) goto LAB_0012054f;
          pbVar2 = pbVar24 + uVar18;
          pbVar25 = pbVar2;
          puVar23 = __src_00;
          if (pbVar15 < __src) {
            if (pbVar3 + -5 < pbVar2) goto LAB_0012054f;
            uVar26 = (long)__src - (long)pbVar15;
            uVar22 = uVar18 - uVar26;
            if (uVar18 < uVar26 || uVar22 == 0) {
              memmove(pbVar24,pLVar12 + -uVar26,uVar18);
            }
            else {
              memcpy(pbVar24,pLVar12 + -uVar26,uVar26);
              pbVar25 = pbVar24 + uVar26;
              if ((ulong)((long)pbVar25 - (long)__src) < uVar22) {
                pbVar24 = __src;
                if (uVar26 < uVar18) {
                  do {
                    *pbVar25 = *pbVar24;
                    pbVar25 = pbVar25 + 1;
                    pbVar24 = pbVar24 + 1;
                  } while (pbVar25 < pbVar2);
                }
              }
              else {
                memcpy(pbVar25,__src,uVar22);
                pbVar25 = pbVar2;
              }
            }
          }
          else {
            if (uVar5 < 0x10) {
              if (uVar26 == 4) {
                iVar10 = *(int *)pbVar15;
              }
              else if (uVar5 == 2) {
                iVar10 = CONCAT22(*(undefined2 *)pbVar15,*(undefined2 *)pbVar15);
              }
              else {
                if (uVar5 != 1) {
                  if (uVar5 < 8) {
                    pbVar24[0] = 0;
                    pbVar24[1] = 0;
                    pbVar24[2] = 0;
                    pbVar24[3] = 0;
                    *pbVar24 = *pbVar15;
                    pbVar24[1] = pbVar15[1];
                    pbVar24[2] = pbVar15[2];
                    pbVar24[3] = pbVar15[3];
                    uVar9 = inc32table[uVar5];
                    *(undefined4 *)(pbVar24 + 4) = *(undefined4 *)(pbVar15 + uVar9);
                    pbVar15 = pbVar15 + ((ulong)uVar9 - (long)dec64table[uVar5]);
                  }
                  else {
                    *(undefined8 *)pbVar24 = *(undefined8 *)pbVar15;
                    pbVar15 = pbVar15 + 8;
                  }
                  pbVar24 = pbVar24 + 8;
                  do {
                    *(undefined8 *)pbVar24 = *(undefined8 *)pbVar15;
                    pbVar24 = pbVar24 + 8;
                    pbVar15 = pbVar15 + 8;
                  } while (pbVar24 < pbVar2);
                  goto LAB_0011fe23;
                }
                iVar10 = (uint)*pbVar15 * 0x1010101;
              }
              *(int *)pbVar24 = iVar10;
              *(int *)(pbVar24 + 4) = iVar10;
              if (8 < uVar18) {
                pbVar24 = pbVar24 + 8;
                do {
                  *(int *)pbVar24 = iVar10;
                  *(int *)(pbVar24 + 4) = iVar10;
                  pbVar24 = pbVar24 + 8;
                } while (pbVar24 < pbVar2);
              }
              goto LAB_0011fe23;
            }
            do {
              uVar7 = *(undefined8 *)(pbVar24 + -uVar26 + 8);
              *(undefined8 *)pbVar24 = *(undefined8 *)(pbVar24 + -uVar26);
              *(undefined8 *)(pbVar24 + 8) = uVar7;
              uVar7 = *(undefined8 *)(pbVar24 + -uVar26 + 0x10 + 8);
              *(undefined8 *)(pbVar24 + 0x10) = *(undefined8 *)(pbVar24 + -uVar26 + 0x10);
              *(undefined8 *)(pbVar24 + 0x18) = uVar7;
              pbVar24 = pbVar24 + 0x20;
            } while (pbVar24 < pbVar2);
          }
          goto LAB_0011fe23;
        }
        uVar9 = LZ4_decompress_safe_withSmallPrefix(source,dest,compressedSize,maxOutputSize,uVar22)
        ;
      }
      else {
        uVar9 = LZ4_decompress_safe_withPrefix64k(source,dest,compressedSize,maxOutputSize);
      }
      goto LAB_0012055a;
    }
    (LZ4_streamDecode->internal_donotuse).extDictSize = uVar22;
    pLVar12 = (LZ4_streamDecode->internal_donotuse).prefixEnd + -uVar22;
    (LZ4_streamDecode->internal_donotuse).externalDict = pLVar12;
    uVar9 = LZ4_decompress_safe_forceExtDict
                      (source,dest,compressedSize,maxOutputSize,pLVar12,uVar22);
  }
  if ((int)uVar9 < 1) {
    return uVar9;
  }
  LZ4_streamDecode->table[3] = (ulong)uVar9;
  (LZ4_streamDecode->internal_donotuse).prefixEnd = (LZ4_byte *)(dest + uVar9);
  return uVar9;
LAB_001203e7:
  if ((uVar6 < 0x10000) && (pbVar15 + uVar6 < __src)) goto LAB_0012054f;
  pbVar2 = pbVar24 + uVar18;
  pbVar25 = pbVar2;
  if (pbVar15 < __src) {
    if (pbVar3 + -5 < pbVar2) goto LAB_0012054f;
    uVar26 = (long)__src - (long)pbVar15;
    uVar22 = uVar18 - uVar26;
    if (uVar18 < uVar26 || uVar22 == 0) {
      memmove(pbVar24,pLVar12 + -uVar26,uVar18);
    }
    else {
      memcpy(pbVar24,pLVar12 + -uVar26,uVar26);
      pbVar25 = pbVar24 + uVar26;
      if ((ulong)((long)pbVar25 - (long)__src) < uVar22) {
        pbVar24 = __src;
        if (uVar26 < uVar18) {
          do {
            *pbVar25 = *pbVar24;
            pbVar25 = pbVar25 + 1;
            pbVar24 = pbVar24 + 1;
          } while (pbVar25 < pbVar2);
        }
      }
      else {
        memcpy(pbVar25,__src,uVar22);
        pbVar25 = pbVar2;
      }
    }
  }
  else {
    if ((uint)uVar26 < 8) {
      pbVar24[0] = 0;
      pbVar24[1] = 0;
      pbVar24[2] = 0;
      pbVar24[3] = 0;
      *pbVar24 = *pbVar15;
      pbVar24[1] = pbVar15[1];
      pbVar24[2] = pbVar15[2];
      pbVar24[3] = pbVar15[3];
      uVar22 = (ulong)((uint)uVar26 << 2);
      uVar26 = (ulong)*(uint *)((long)inc32table + uVar22);
      *(undefined4 *)(pbVar24 + 4) = *(undefined4 *)(pbVar15 + uVar26);
      pbVar15 = pbVar15 + (uVar26 - (long)*(int *)((long)dec64table + uVar22));
    }
    else {
      *(undefined8 *)pbVar24 = *(undefined8 *)pbVar15;
      pbVar15 = pbVar15 + 8;
    }
    pbVar16 = pbVar24 + 8;
    if (pbVar3 + -0xc < pbVar2) {
      if (pbVar3 + -5 < pbVar2) goto LAB_0012054f;
      pbVar24 = pbVar3 + -7;
      pbVar19 = pbVar15;
      pbVar20 = pbVar16;
      if (pbVar16 < pbVar24) {
        do {
          *(undefined8 *)pbVar20 = *(undefined8 *)pbVar19;
          pbVar20 = pbVar20 + 8;
          pbVar19 = pbVar19 + 8;
        } while (pbVar20 < pbVar24);
        pbVar15 = pbVar15 + ((long)pbVar24 - (long)pbVar16);
        pbVar16 = pbVar24;
      }
      for (; pbVar16 < pbVar2; pbVar16 = pbVar16 + 1) {
        bVar4 = *pbVar15;
        pbVar15 = pbVar15 + 1;
        *pbVar16 = bVar4;
      }
    }
    else {
      *(undefined8 *)pbVar16 = *(undefined8 *)pbVar15;
      if (0x10 < uVar18) {
        pbVar24 = pbVar24 + 0x10;
        do {
          pbVar15 = pbVar15 + 8;
          *(undefined8 *)pbVar24 = *(undefined8 *)pbVar15;
          pbVar24 = pbVar24 + 8;
        } while (pbVar24 < pbVar2);
      }
    }
  }
LAB_00120506:
  bVar4 = (byte)*__src_00;
  __src_00 = (ushort *)((long)__src_00 + 1);
  while( true ) {
    uVar9 = (uint)bVar4;
    if (bVar4 >> 4 == 0xf) break;
    uVar22 = (ulong)(uint)(bVar4 >> 4);
    if ((source + (long)compressedSize + -0x10 <= __src_00) ||
       (dest + (long)maxOutputSize + -0x20 < pbVar25)) goto LAB_0012035b;
    uVar7 = *(undefined8 *)(__src_00 + 4);
    *(undefined8 *)pbVar25 = *(undefined8 *)__src_00;
    *(undefined8 *)(pbVar25 + 8) = uVar7;
    pbVar24 = pbVar25 + uVar22;
    uVar18 = (ulong)(uVar9 & 0xf);
    puVar23 = (ushort *)((long)__src_00 + uVar22);
    uVar26 = (ulong)*puVar23;
    pbVar15 = pbVar24 + -uVar26;
    if ((((uVar9 & 0xf) == 0xf) || (*puVar23 < 8)) || (pbVar15 < __src)) goto LAB_001203a4;
    *(undefined8 *)pbVar24 = *(undefined8 *)pbVar15;
    *(undefined8 *)(pbVar24 + 8) = *(undefined8 *)(pbVar15 + 8);
    *(undefined2 *)(pbVar24 + 0x10) = *(undefined2 *)(pbVar15 + 0x10);
    pbVar25 = pbVar24 + uVar18 + 4;
    bVar4 = *(byte *)((long)__src_00 + uVar22 + 2);
    __src_00 = (ushort *)((long)__src_00 + uVar22 + 3);
  }
  if ((ushort *)((long)puVar1 - 0xfU) <= __src_00) goto LAB_0012054f;
  pbVar24 = (byte *)((long)__src_00 + 1);
  uVar17 = 0;
  do {
    uVar5 = *__src_00;
    __src_00 = (ushort *)((long)__src_00 + 1);
    uVar17 = uVar17 + (byte)uVar5;
    pbVar24 = pbVar24 + 1;
  } while (__src_00 < (ushort *)((long)puVar1 - 0xfU) && (byte)uVar5 == 0xff);
  uVar22 = (ulong)uVar17 + 0xf;
  if ((CARRY8((ulong)pbVar25,uVar22)) || ((ulong)-(long)pbVar24 < uVar22)) goto LAB_0012054f;
LAB_0012035b:
  pbVar24 = pbVar25 + uVar22;
LAB_0012035f:
  puVar23 = (ushort *)((long)__src_00 + uVar22);
  if ((pbVar3 + -0xc < pbVar24) || (puVar1 + -4 < puVar23)) {
    if ((puVar23 != puVar1) || (pbVar3 < pbVar24)) goto LAB_0012054f;
    memmove(pbVar25,__src_00,uVar22);
    local_80 = (int)dest;
    uVar9 = ((int)pbVar25 + (int)uVar22) - local_80;
    goto LAB_0012055a;
  }
  do {
    *(undefined8 *)pbVar25 = *(undefined8 *)__src_00;
    pbVar25 = pbVar25 + 8;
    __src_00 = __src_00 + 4;
  } while (pbVar25 < pbVar24);
  uVar26 = (ulong)*puVar23;
  pbVar15 = pbVar24 + -uVar26;
  uVar18 = (ulong)(uVar9 & 0xf);
LAB_001203a4:
  __src_00 = puVar23 + 1;
  if ((int)uVar18 == 0xf) {
    uVar18 = 0;
    do {
      puVar23 = __src_00;
      __src_00 = (ushort *)((long)puVar23 + 1);
      if (puVar1 + -2 <= __src_00) goto LAB_0012054c;
      uVar18 = (ulong)((int)uVar18 + (uint)(byte)*puVar23);
    } while ((byte)*puVar23 == 0xff);
    uVar18 = uVar18 + 0xf;
    if (CARRY8((ulong)pbVar24,uVar18)) goto LAB_0012054c;
  }
  uVar18 = uVar18 + 4;
  goto LAB_001203e7;
LAB_0012054c:
  __src_00 = (ushort *)((long)puVar23 + 1);
LAB_0012054f:
  local_70 = (int)source;
  uVar9 = ~(uint)__src_00 + local_70;
LAB_0012055a:
  if (0 < (int)uVar9) {
    LZ4_streamDecode->table[3] = LZ4_streamDecode->table[3] + (ulong)uVar9;
    (LZ4_streamDecode->internal_donotuse).prefixEnd =
         (LZ4_streamDecode->internal_donotuse).prefixEnd + uVar9;
  }
  return uVar9;
}

Assistant:

LZ4_FORCE_O2
int LZ4_decompress_safe_continue (LZ4_streamDecode_t* LZ4_streamDecode, const char* source, char* dest, int compressedSize, int maxOutputSize)
{
    LZ4_streamDecode_t_internal* lz4sd = &LZ4_streamDecode->internal_donotuse;
    int result;

    if (lz4sd->prefixSize == 0) {
        /* The first call, no dictionary yet. */
        assert(lz4sd->extDictSize == 0);
        result = LZ4_decompress_safe(source, dest, compressedSize, maxOutputSize);
        if (result <= 0) return result;
        lz4sd->prefixSize = (size_t)result;
        lz4sd->prefixEnd = (BYTE*)dest + result;
    } else if (lz4sd->prefixEnd == (BYTE*)dest) {
        /* They're rolling the current segment. */
        if (lz4sd->prefixSize >= 64 KB - 1)
            result = LZ4_decompress_safe_withPrefix64k(source, dest, compressedSize, maxOutputSize);
        else if (lz4sd->extDictSize == 0)
            result = LZ4_decompress_safe_withSmallPrefix(source, dest, compressedSize, maxOutputSize,
                                                         lz4sd->prefixSize);
        else
            result = LZ4_decompress_safe_doubleDict(source, dest, compressedSize, maxOutputSize,
                                                    lz4sd->prefixSize, lz4sd->externalDict, lz4sd->extDictSize);
        if (result <= 0) return result;
        lz4sd->prefixSize += (size_t)result;
        lz4sd->prefixEnd  += result;
    } else {
        /* The buffer wraps around, or they're switching to another buffer. */
        lz4sd->extDictSize = lz4sd->prefixSize;
        lz4sd->externalDict = lz4sd->prefixEnd - lz4sd->extDictSize;
        result = LZ4_decompress_safe_forceExtDict(source, dest, compressedSize, maxOutputSize,
                                                  lz4sd->externalDict, lz4sd->extDictSize);
        if (result <= 0) return result;
        lz4sd->prefixSize = (size_t)result;
        lz4sd->prefixEnd  = (BYTE*)dest + result;
    }

    return result;
}